

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O2

string * __thiscall
kratos::InterfaceDefinition::port
          (string *__return_storage_ptr__,InterfaceDefinition *this,string *name,uint32_t width,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *size,PortDirection dir,PortType type)

{
  _Head_base<1UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_false> *this_00;
  iterator iVar1;
  UserException *this_01;
  undefined4 in_register_0000008c;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar2;
  basic_string_view<char> bVar3;
  string_view format_str;
  format_args args;
  string local_88;
  tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
  local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  uint32_t local_34;
  
  aVar2._4_4_ = in_register_0000008c;
  aVar2._0_4_ = dir;
  local_40 = size;
  local_34 = width;
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>_>_>_>
                  *)&this->ports_,name);
  if (iVar1._M_node == (_Base_ptr)&this->field_0x40) {
    this_00 = &local_68.
               super__Tuple_impl<0UL,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
               .
               super__Tuple_impl<1UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
               .
               super__Head_base<1UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_false>
    ;
    local_68.
    super__Tuple_impl<0UL,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
    .
    super__Tuple_impl<1UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
    .super__Tuple_impl<2UL,_kratos::PortDirection,_kratos::PortType>.
    super__Head_base<2UL,_kratos::PortDirection,_false>._M_head_impl = dir;
    local_68.
    super__Tuple_impl<0UL,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
    .
    super__Tuple_impl<1UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
    .super__Tuple_impl<2UL,_kratos::PortDirection,_kratos::PortType>.
    super__Tuple_impl<3UL,_kratos::PortType>.super__Head_base<3UL,_kratos::PortType,_false>.
    _M_head_impl = (_Head_base<3UL,_kratos::PortType,_false>)
                   (_Head_base<3UL,_kratos::PortType,_false>)type;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&this_00->_M_head_impl,local_40);
    local_68.
    super__Tuple_impl<0UL,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
    .super__Head_base<0UL,_unsigned_int,_false>._M_head_impl = local_34;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,kratos::PortDirection,kratos::PortType>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,kratos::PortDirection,kratos::PortType>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,kratos::PortDirection,kratos::PortType>>>>
    ::
    _M_emplace_unique<std::__cxx11::string_const&,std::tuple<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,kratos::PortDirection,kratos::PortType>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,kratos::PortDirection,kratos::PortType>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,kratos::PortDirection,kratos::PortType>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,kratos::PortDirection,kratos::PortType>>>>
                *)&this->ports_,name,&local_68);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
    return __return_storage_ptr__;
  }
  this_01 = (UserException *)__cxa_allocate_exception(0x10);
  local_68.
  super__Tuple_impl<0UL,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
  .
  super__Tuple_impl<1UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
  .super__Tuple_impl<2UL,_kratos::PortDirection,_kratos::PortType> =
       (_Tuple_impl<2UL,_kratos::PortDirection,_kratos::PortType>)(name->_M_dataplus)._M_p;
  local_68.
  super__Tuple_impl<0UL,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
  .
  super__Tuple_impl<1UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
  .super__Head_base<1UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_false>.
  _M_head_impl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)name->_M_string_length;
  local_68.
  super__Tuple_impl<0UL,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
  .
  super__Tuple_impl<1UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
  .super__Head_base<1UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_false>.
  _M_head_impl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(this->name_)._M_dataplus._M_p;
  local_68.
  super__Tuple_impl<0UL,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
  .
  super__Tuple_impl<1UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
  .super__Head_base<1UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_false>.
  _M_head_impl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(this->name_)._M_string_length;
  bVar3 = fmt::v7::to_string_view<char,_0>("{0} already exists in {1}");
  format_str.data_ = (char *)bVar3.size_;
  format_str.size_ = 0xdd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = aVar2.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_68;
  fmt::v7::detail::vformat_abi_cxx11_(&local_88,(detail *)bVar3.data_,format_str,args);
  UserException::UserException(this_01,&local_88);
  __cxa_throw(this_01,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string InterfaceDefinition::port(const std::string& name, uint32_t width,
                                      const std::vector<uint32_t>& size,
                                      enum kratos::PortDirection dir, PortType type) {
    if (ports_.find(name) != ports_.end())
        throw UserException(::format("{0} already exists in {1}", name, name_));
    ports_.emplace(name, std::make_tuple(width, size, dir, type));
    return name;
}